

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

string * __thiscall cmMakefile::GetRequiredDefinition(cmMakefile *this,string *name)

{
  int iVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetRequiredDefinition(std::__cxx11::string_const&)::
                                 empty_abi_cxx11_);
    if (iVar1 != 0) {
      GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_.field_2;
      GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_._M_string_length = 0;
      GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_.field_2._M_local_buf[0] =
           '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_);
    }
  }
  psVar2 = GetDef(this,name);
  if (psVar2 == (string *)0x0) {
    std::operator+(&local_30,
                   "Error required internal CMake variable not set, cmake may not be built correctly.\nMissing variable is:\n"
                   ,name);
    cmSystemTools::Error(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    psVar2 = &GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

const std::string& cmMakefile::GetRequiredDefinition(
  const std::string& name) const
{
  static std::string const empty;
  const std::string* def = GetDef(name);
  if (!def) {
    cmSystemTools::Error("Error required internal CMake variable not "
                         "set, cmake may not be built correctly.\n"
                         "Missing variable is:\n" +
                         name);
    return empty;
  }
  return *def;
}